

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void writePlannerStats(vector<PlannerStats,_std::allocator<PlannerStats>_> *s,FILE *fout)

{
  bool bVar1;
  pointer pPVar2;
  ulong uVar3;
  ulong uVar4;
  
  fprintf((FILE *)fout,"%%eps time expands cost\n");
  pPVar2 = (s->super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((s->super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      fprintf((FILE *)fout,"%f %f %d %d\n",pPVar2[uVar3].eps,pPVar2[uVar3].time,
              (ulong)(uint)pPVar2[uVar3].expands,(ulong)(uint)pPVar2[uVar3].cost);
      pPVar2 = (s->super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = uVar4 < (ulong)((long)(s->
                                    super__Vector_base<PlannerStats,_std::allocator<PlannerStats>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 >> 5);
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  return;
}

Assistant:

void writePlannerStats(vector<PlannerStats> s, FILE* fout)
{
    fprintf(fout, "%%eps time expands cost\n");
    for (unsigned int i = 0; i < s.size(); i++) {
        fprintf(fout, "%f %f %d %d\n", s[i].eps, s[i].time, s[i].expands, s[i].cost);
    }
}